

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Compiler.cpp
# Opt level: O1

int __thiscall soul::Compiler::link(Compiler *this,char *__from,char *__to)

{
  Namespace *ns;
  long lVar1;
  pointer pcVar2;
  double dVar3;
  bool bVar4;
  Module *pMVar5;
  undefined4 *in_RCX;
  Compiler *this_00;
  ProcessorBase *in_R8;
  long in_FS_OFFSET;
  string_view moduleName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ScopedTimer timer___LINE__;
  CompileMessageHandler handler;
  long *local_1c0 [2];
  long local_1b0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1a0;
  size_type local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  CodeLocation local_180;
  ScopedTimer local_170;
  Compiler *local_148;
  undefined8 uStack_140;
  code *local_138;
  code *pcStack_130;
  _Any_data local_128;
  code *local_118;
  code *local_110;
  undefined8 local_108;
  undefined1 local_f8 [40];
  _Alloc_hider local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  vector<soul::SourceFile,_std::allocator<soul::SourceFile>_> local_b0;
  Value local_98;
  
  local_1a0 = &local_190;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"link time","");
  local_170.description._M_dataplus._M_p = (pointer)&local_170.description.field_2;
  if (local_1a0 == &local_190) {
    local_170.description.field_2._8_8_ = local_190._8_8_;
  }
  else {
    local_170.description._M_dataplus._M_p = (pointer)local_1a0;
  }
  local_170.description._M_string_length = local_198;
  local_198 = 0;
  local_190._M_local_buf[0] = '\0';
  local_1a0 = &local_190;
  local_170.start.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  if (local_1a0 != &local_190) {
    operator_delete(local_1a0,
                    CONCAT71(local_190._M_allocated_capacity._1_7_,local_190._M_local_buf[0]) + 1);
  }
  local_110 = std::
              _Function_handler<void_(const_soul::CompileMessageGroup_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/diagnostics/soul_CompileMessageList.cpp:200:30)>
              ::_M_invoke;
  local_128._8_8_ = 0;
  local_118 = std::
              _Function_handler<void_(const_soul::CompileMessageGroup_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/diagnostics/soul_CompileMessageList.cpp:200:30)>
              ::_M_manager;
  local_108 = *(undefined8 *)(in_FS_OFFSET + -8);
  *(_Any_data **)(in_FS_OFFSET + -8) = &local_128;
  local_128._M_unused._0_8_ = (undefined8)__to;
  if (*(ModuleBase **)(__from + 0x60) != (ModuleBase *)0x0) {
    ASTUtilities::resolveHoistedEndpoints((Allocator *)__from,*(ModuleBase **)(__from + 0x60));
    ns = *(Namespace **)(__from + 0x60);
    if (ns != (Namespace *)0x0) {
      do {
        bVar4 = ASTUtilities::mergeFirstPairOfDuplicateNamespaces(ns);
      } while (bVar4);
      if (*(Namespace **)(__from + 0x60) != (Namespace *)0x0) {
        ASTUtilities::removeModulesWithSpecialisationParams(*(Namespace **)(__from + 0x60));
        if (*(ModuleBase **)(__from + 0x60) != (ModuleBase *)0x0) {
          ResolutionPass::run((Allocator *)__from,*(ModuleBase **)(__from + 0x60),false);
          moduleName._M_str = (char *)0xc;
          moduleName._M_len = (size_t)&local_180;
          getSystemModule(moduleName);
          compile((Compiler *)__from,&local_180);
          RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_180.sourceCode.object);
          if (*(Namespace **)(__from + 0x60) != (Namespace *)0x0) {
            ConvertComplexPass::run((Allocator *)__from,*(Namespace **)(__from + 0x60));
            ASTUtilities::connectAnyChildEndpointsNeedingToBeExposed((Allocator *)__from,in_R8);
            Program::Program((Program *)this);
            lVar1 = (long)(this->allocator).pool.pools.
                          super__Vector_base<std::unique_ptr<soul::PoolAllocator::Pool,_std::default_delete<soul::PoolAllocator::Pool>_>,_std::allocator<std::unique_ptr<soul::PoolAllocator::Pool,_std::default_delete<soul::PoolAllocator::Pool>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
            this_00 = (Compiler *)(lVar1 + 0x280);
            std::vector<soul::StringDictionary::Item,_std::allocator<soul::StringDictionary::Item>_>
            ::operator=((vector<soul::StringDictionary::Item,_std::allocator<soul::StringDictionary::Item>_>
                         *)this_00,
                        (vector<soul::StringDictionary::Item,_std::allocator<soul::StringDictionary::Item>_>
                         *)(__from + 0x40));
            *(undefined4 *)(lVar1 + 0x298) = *(undefined4 *)(__from + 0x58);
            if (*(Namespace **)(__from + 0x60) != (Namespace *)0x0) {
              compileAllModules(this_00,*(Namespace **)(__from + 0x60),(Program *)this,in_R8);
              heart::Utilities::inlineFunctionsThatUseAdvanceOrStreams<soul::Optimisations>
                        ((Program *)this);
              local_f8._32_8_ = *(undefined8 *)(in_RCX + 8);
              local_f8._0_4_ = *in_RCX;
              local_f8._4_4_ = in_RCX[1];
              local_f8._8_4_ = in_RCX[2];
              local_f8._12_4_ = in_RCX[3];
              local_f8._16_4_ = in_RCX[4];
              local_f8._20_4_ = in_RCX[5];
              local_f8._24_4_ = in_RCX[6];
              local_f8._28_4_ = in_RCX[7];
              local_d0._M_p = (pointer)&local_c0;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_d0,*(long *)(in_RCX + 10),
                         *(long *)(in_RCX + 0xc) + *(long *)(in_RCX + 10));
              std::vector<soul::SourceFile,_std::allocator<soul::SourceFile>_>::vector
                        (&local_b0,
                         (vector<soul::SourceFile,_std::allocator<soul::SourceFile>_> *)
                         (in_RCX + 0x12));
              choc::value::Value::Value(&local_98,(Value *)(in_RCX + 0x18));
              heart::Checker::sanityCheck((Program *)this,(BuildSettings *)local_f8);
              choc::value::Value::~Value(&local_98);
              std::vector<soul::SourceFile,_std::allocator<soul::SourceFile>_>::~vector(&local_b0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d0._M_p != &local_c0) {
                operator_delete(local_d0._M_p,local_c0._M_allocated_capacity + 1);
              }
              if (in_RCX[8] != 0) {
                Optimisations::removeUnusedObjects((Program *)this);
              }
              __from[0x60] = '\0';
              __from[0x61] = '\0';
              __from[0x62] = '\0';
              __from[99] = '\0';
              __from[100] = '\0';
              __from[0x65] = '\0';
              __from[0x66] = '\0';
              __from[0x67] = '\0';
              PoolAllocator::clear((PoolAllocator *)__from);
              std::
              vector<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::_M_erase_at_end((vector<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 *)(__from + 0x20),*(pointer *)(__from + 0x20));
              bVar4 = Logger::isLoggingEnabled();
              if (bVar4) {
                pMVar5 = Program::getMainProcessor((Program *)this);
                pcVar2 = (pMVar5->originalFullName)._M_dataplus._M_p;
                local_1c0[0] = local_1b0;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_1c0,pcVar2,
                           pcVar2 + (pMVar5->originalFullName)._M_string_length);
                std::__cxx11::string::append((char *)local_1c0);
                uStack_140 = 0;
                pcStack_130 = std::
                              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/compiler/soul_Compiler.cpp:271:9)>
                              ::_M_invoke;
                local_138 = std::
                            _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/compiler/soul_Compiler.cpp:271:9)>
                            ::_M_manager;
                local_148 = this;
                dVar3 = Logger::log(0.0);
                if (local_138 != (code *)0x0) {
                  (*local_138)(SUB84(dVar3,0),&local_148,&local_148,3);
                }
                if (local_1c0[0] != local_1b0) {
                  operator_delete(local_1c0[0],local_1b0[0] + 1);
                }
              }
              heart::Checker::testHEARTRoundTrip((Program *)this);
              Optimisations::optimiseFunctionBlocks((Program *)this);
              Optimisations::removeUnusedVariables((Program *)this);
              CompileMessageHandler::~CompileMessageHandler((CompileMessageHandler *)&local_128);
              ScopedTimer::~ScopedTimer(&local_170);
              return (int)this;
            }
            throwInternalCompilerError("object != nullptr","operator*",0x3b);
          }
        }
      }
    }
  }
  throwInternalCompilerError("object != nullptr","operator*",0x3b);
}

Assistant:

Program Compiler::link (CompileMessageList& messageList, const BuildSettings& settings, AST::ProcessorBase& processorToRun)
{
    try
    {
        SOUL_LOG_TIME_OF_SCOPE ("link time");
        CompileMessageHandler handler (messageList);
        ASTUtilities::resolveHoistedEndpoints (allocator, *topLevelNamespace);
        ASTUtilities::mergeDuplicateNamespaces (*topLevelNamespace);
        ASTUtilities::removeModulesWithSpecialisationParams (*topLevelNamespace);
        ResolutionPass::run (allocator, *topLevelNamespace, false);

        compile (getSystemModule ("soul.complex"));
        ConvertComplexPass::run (allocator, *topLevelNamespace);

        ASTUtilities::connectAnyChildEndpointsNeedingToBeExposed (allocator, processorToRun);

        Program program;
        program.getStringDictionary() = allocator.stringDictionary;  // Bring the existing string dictionary along so that the handles match
        compileAllModules (*topLevelNamespace, program, processorToRun);
        heart::Utilities::inlineFunctionsThatUseAdvanceOrStreams<Optimisations> (program);
        heart::Checker::sanityCheck (program, settings);

        if (settings.optimisationLevel != 0)
        {
            Optimisations::removeUnusedObjects (program);
        }

        reset();

        SOUL_LOG (program.getMainProcessor().originalFullName + ": linked HEART",
                  [&] { return program.toHEART(); });

        heart::Checker::testHEARTRoundTrip (program);
        Optimisations::optimiseFunctionBlocks (program);
        Optimisations::removeUnusedVariables (program);

        return program;
    }
    catch (AbortCompilationException) {}

    return {};
}